

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O2

TRef lj_opt_narrow_index(jit_State *J,TRef tr)

{
  byte bVar1;
  IRRef1 IVar2;
  IRRef1 IVar3;
  IRIns *pIVar4;
  TRef TVar5;
  ulong uVar6;
  
  if ((tr & 0x1f000000) == 0xe000000) {
    (J->fold).ins.field_0.op1 = (IRRef1)tr;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5993226e;
    TVar5 = lj_opt_fold(J);
    return TVar5;
  }
  pIVar4 = (J->cur).ir;
  uVar6 = (ulong)(tr & 0xffff);
  bVar1 = *(byte *)((long)pIVar4 + uVar6 * 8 + 5);
  if ((byte)(bVar1 - 0x35) < 2) {
    IVar2 = *(IRRef1 *)((long)pIVar4 + uVar6 * 8 + 2);
    if ((-1 < (long)(short)IVar2) && (-1 < (int)(pIVar4[(short)IVar2].field_1.op12 + 0x40000000))) {
      IVar3 = pIVar4[uVar6].field_0.op1;
      (J->fold).ins.field_0.ot = (ushort)bVar1 * 0x100 - 0xbed;
      (J->fold).ins.field_0.op1 = IVar3;
      (J->fold).ins.field_0.op2 = IVar2;
      TVar5 = lj_opt_fold(J);
      return TVar5;
    }
  }
  return tr;
}

Assistant:

TRef LJ_FASTCALL lj_opt_narrow_index(jit_State *J, TRef tr)
{
  IRIns *ir;
  lj_assertJ(tref_isnumber(tr), "expected number type");
  if (tref_isnum(tr))  /* Conversion may be narrowed, too. See above. */
    return emitir(IRTGI(IR_CONV), tr, IRCONV_INT_NUM|IRCONV_INDEX);
  /* Omit some overflow checks for array indexing. See comments above. */
  ir = IR(tref_ref(tr));
  if ((ir->o == IR_ADDOV || ir->o == IR_SUBOV) && irref_isk(ir->op2) &&
      (uint32_t)IR(ir->op2)->i + 0x40000000u < 0x80000000u)
    return emitir(IRTI(ir->o - IR_ADDOV + IR_ADD), ir->op1, ir->op2);
  return tr;
}